

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O1

void ObsGetDiscard(pyhanabi_observation_t *observation,int index,pyhanabi_card_t *card)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (observation == (pyhanabi_observation_t *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x2d7,"void ObsGetDiscard(pyhanabi_observation_t *, int, pyhanabi_card_t *)");
  }
  pvVar1 = observation->observation;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("observation->observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x2d8,"void ObsGetDiscard(pyhanabi_observation_t *, int, pyhanabi_card_t *)");
  }
  if (card == (pyhanabi_card_t *)0x0) {
    __assert_fail("card != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x2d9,"void ObsGetDiscard(pyhanabi_observation_t *, int, pyhanabi_card_t *)");
  }
  uVar3 = (ulong)index;
  uVar2 = *(long *)((long)pvVar1 + 0x28) - *(long *)((long)pvVar1 + 0x20) >> 3;
  if (uVar3 < uVar2) {
    *card = *(pyhanabi_card_t *)(*(long *)((long)pvVar1 + 0x20) + uVar3 * 8);
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3,uVar2
            );
}

Assistant:

void ObsGetDiscard(pyhanabi_observation_t* observation, int index,
                   pyhanabi_card_t* card) {
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  REQUIRE(card != nullptr);
  hanabi_learning_env::HanabiCard hanabi_card =
      reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
          observation->observation)
          ->DiscardPile()
          .at(index);
  card->color = hanabi_card.Color();
  card->rank = hanabi_card.Rank();
}